

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::NodeRef>::
emplaceRealloc<slang::IntervalMapDetails::NodeRef_const&>
          (SmallVectorBase<slang::IntervalMapDetails::NodeRef> *this,pointer pos,NodeRef *args)

{
  ulong uVar1;
  pointer p;
  pointer pNVar2;
  pointer pNVar3;
  pointer pNVar4;
  long lVar5;
  long lVar6;
  size_type sVar7;
  ulong uVar8;
  
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  uVar8 = this->len + 1;
  uVar1 = this->cap;
  if (uVar8 < uVar1 * 2) {
    uVar8 = uVar1 * 2;
  }
  if (0xfffffffffffffff - uVar1 < uVar1) {
    uVar8 = 0xfffffffffffffff;
  }
  lVar6 = (long)pos - (long)this->data_;
  pNVar2 = (pointer)operator_new(uVar8 * 8);
  *(uintptr_t *)((long)pNVar2 + lVar6) = (args->pip).value;
  p = this->data_;
  sVar7 = this->len;
  lVar5 = (long)p + (sVar7 * 8 - (long)pos);
  pNVar3 = p;
  pNVar4 = pNVar2;
  if (lVar5 == 0) {
    pNVar3 = pNVar2;
    pNVar4 = p;
    if (sVar7 != 0) {
      do {
        (pNVar3->pip).value = (pNVar4->pip).value;
        pNVar4 = pNVar4 + 1;
        pNVar3 = pNVar3 + 1;
      } while (pNVar4 != pos);
    }
  }
  else {
    for (; pNVar3 != pos; pNVar3 = pNVar3 + 1) {
      (pNVar4->pip).value = (pNVar3->pip).value;
      pNVar4 = pNVar4 + 1;
    }
    memcpy((void *)((long)pNVar2 + lVar6 + 8),pos,(lVar5 - 8U & 0xfffffffffffffff8) + 8);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar7 = this->len;
  }
  this->len = sVar7 + 1;
  this->cap = uVar8;
  this->data_ = pNVar2;
  return (pointer)((long)pNVar2 + lVar6);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}